

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseTools.cpp
# Opt level: O1

void __thiscall tonk::RefCounter::StartShutdown(RefCounter *this,uint reason,Result *result)

{
  int iVar1;
  string local_40;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->ShutdownLock);
  if (iVar1 == 0) {
    if (((this->Shutdown)._M_base._M_i & 1U) == 0) {
      this->ShutdownReason = reason;
      Result::ToJson_abi_cxx11_(&local_40,result);
      std::__cxx11::string::operator=((string *)&this->ShutdownJson,(string *)&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p);
      }
      LOCK();
      (this->Shutdown)._M_base._M_i = true;
      UNLOCK();
      LOCK();
      (this->RefCount).super___atomic_base<int>._M_i =
           (this->RefCount).super___atomic_base<int>._M_i + -1;
      UNLOCK();
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->ShutdownLock);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void RefCounter::StartShutdown(unsigned reason, const Result& result)
{
    std::lock_guard<std::mutex> locker(ShutdownLock);

    if (Shutdown) {
        return;
    }

    ShutdownReason = reason;
    ShutdownJson = result.ToJson();

    Shutdown = true;

    // Remove self reference
    DecrementReferences();
}